

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# substitute.cc
# Opt level: O1

void google::protobuf::strings::SubstituteAndAppend
               (string *output,char *format,SubstituteArg *arg0,SubstituteArg *arg1,
               SubstituteArg *arg2,SubstituteArg *arg3,SubstituteArg *arg4,SubstituteArg *arg5,
               SubstituteArg *arg6,SubstituteArg *arg7,SubstituteArg *arg8,SubstituteArg *arg9)

{
  byte bVar1;
  size_type sVar2;
  string *psVar3;
  char cVar4;
  pointer pcVar5;
  LogMessage *pLVar6;
  int iVar7;
  SubstituteArg *pSVar8;
  int iVar9;
  ulong uVar10;
  uint uVar11;
  int iVar12;
  long lVar13;
  char *__dest;
  bool bVar14;
  SubstituteArg *local_128;
  SubstituteArg *args_array [11];
  LogMessage local_c8;
  ulong local_90;
  SubstituteArg *local_88;
  string *local_80;
  string local_78;
  string local_58;
  int local_38;
  allocator local_32;
  LogFinisher local_31;
  
  local_80 = output;
  local_88 = arg0;
  args_array[0] = arg1;
  args_array[1] = arg2;
  args_array[2] = arg3;
  args_array[3] = arg4;
  args_array[4] = arg5;
  args_array[5] = arg6;
  args_array[6] = arg7;
  args_array[7] = arg8;
  args_array[8] = arg9;
  args_array[9] = (SubstituteArg *)0x0;
  cVar4 = *format;
  bVar14 = cVar4 != '\0';
  if (cVar4 == '\0') {
    uVar10 = 0;
  }
  else {
    uVar10 = 0;
    lVar13 = 0;
    do {
      iVar12 = (int)lVar13;
      iVar9 = (int)uVar10;
      if (cVar4 == '$') {
        bVar1 = format[(long)iVar12 + 1];
        if ((byte)(bVar1 - 0x30) < 10) {
          uVar11 = bVar1 - 0x30;
          iVar7 = args_array[(ulong)uVar11 - 1]->size_;
          if (iVar7 == -1) {
            local_90 = uVar10;
            local_38 = iVar7;
            internal::LogMessage::LogMessage
                      (&local_c8,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/stubs/substitute.cc"
                       ,0x56);
            pLVar6 = internal::LogMessage::operator<<
                               (&local_c8,"strings::Substitute format string invalid: asked for \"$"
                               );
            pLVar6 = internal::LogMessage::operator<<(pLVar6,uVar11);
            pLVar6 = internal::LogMessage::operator<<(pLVar6,"\", but only ");
            lVar13 = 0;
            pSVar8 = local_88;
            do {
              if (pSVar8->size_ == -1) break;
              pSVar8 = args_array[lVar13];
              lVar13 = lVar13 + 1;
            } while (pSVar8 != (SubstituteArg *)0x0);
            pLVar6 = internal::LogMessage::operator<<(pLVar6,(int)lVar13);
            pLVar6 = internal::LogMessage::operator<<
                               (pLVar6," args were given.  Full format string was: \"");
            std::__cxx11::string::string((string *)&local_58,format,&local_32);
            CEscape(&local_78,&local_58);
            pLVar6 = internal::LogMessage::operator<<(pLVar6,&local_78);
            pLVar6 = internal::LogMessage::operator<<(pLVar6,"\".");
            internal::LogFinisher::operator=(&local_31,pLVar6);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_78._M_dataplus._M_p != &local_78.field_2) {
              operator_delete(local_78._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_58._M_dataplus._M_p != &local_58.field_2) {
              operator_delete(local_58._M_dataplus._M_p);
            }
            internal::LogMessage::~LogMessage(&local_c8);
            uVar10 = local_90;
            iVar7 = local_38;
          }
          else {
            uVar10 = (ulong)(uint)(iVar9 + iVar7);
            iVar12 = iVar12 + 1;
          }
          if (iVar7 == -1) break;
        }
        else {
          if (bVar1 != 0x24) {
            internal::LogMessage::LogMessage
                      (&local_c8,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/stubs/substitute.cc"
                       ,99);
            pLVar6 = internal::LogMessage::operator<<
                               (&local_c8,"Invalid strings::Substitute() format string: \"");
            std::__cxx11::string::string((string *)&local_58,format,&local_32);
            CEscape(&local_78,&local_58);
            pLVar6 = internal::LogMessage::operator<<(pLVar6,&local_78);
            pLVar6 = internal::LogMessage::operator<<(pLVar6,"\".");
            internal::LogFinisher::operator=(&local_31,pLVar6);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_78._M_dataplus._M_p != &local_78.field_2) {
              operator_delete(local_78._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_58._M_dataplus._M_p != &local_58.field_2) {
              operator_delete(local_58._M_dataplus._M_p);
            }
            internal::LogMessage::~LogMessage(&local_c8);
            break;
          }
          uVar10 = (ulong)(iVar9 + 1);
          iVar12 = iVar12 + 1;
        }
      }
      else {
        uVar10 = (ulong)(iVar9 + 1);
      }
      cVar4 = format[(long)iVar12 + 1];
      lVar13 = (long)iVar12 + 1;
      bVar14 = cVar4 != '\0';
    } while (bVar14);
  }
  psVar3 = local_80;
  if ((!bVar14) && ((int)uVar10 != 0)) {
    sVar2 = local_80->_M_string_length;
    iVar12 = 0;
    std::__cxx11::string::resize((ulong)local_80,(char)uVar10 + (char)sVar2);
    if (psVar3->_M_string_length == 0) {
      pcVar5 = (pointer)0x0;
    }
    else {
      pcVar5 = (psVar3->_M_dataplus)._M_p;
    }
    __dest = pcVar5 + (int)sVar2;
    do {
      cVar4 = format[iVar12];
      if (cVar4 == '$') {
        bVar1 = format[(long)iVar12 + 1];
        if ((byte)(bVar1 - 0x30) < 10) {
          uVar11 = bVar1 - 0x30;
          if (9 < uVar11) {
            __assert_fail("index < 10",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/stubs/substitute.cc"
                          ,0x77,
                          "void google::protobuf::strings::SubstituteAndAppend(string *, const char *, const SubstituteArg &, const SubstituteArg &, const SubstituteArg &, const SubstituteArg &, const SubstituteArg &, const SubstituteArg &, const SubstituteArg &, const SubstituteArg &, const SubstituteArg &, const SubstituteArg &)"
                         );
          }
          pSVar8 = args_array[(ulong)uVar11 - 1];
          memcpy(__dest,pSVar8->text_,(long)pSVar8->size_);
          __dest = __dest + pSVar8->size_;
          iVar12 = iVar12 + 1;
        }
        else if (bVar1 == 0x24) {
          *__dest = '$';
          __dest = __dest + 1;
          iVar12 = iVar12 + 1;
        }
      }
      else {
        if (cVar4 == '\0') {
          if ((long)__dest - (long)(psVar3->_M_dataplus)._M_p == psVar3->_M_string_length) {
            return;
          }
          internal::LogMessage::LogMessage
                    (&local_c8,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/stubs/substitute.cc"
                     ,0x85);
          pLVar6 = internal::LogMessage::operator<<
                             (&local_c8,
                              "CHECK failed: (target - output->data()) == (output->size()): ");
          internal::LogFinisher::operator=((LogFinisher *)&local_78,pLVar6);
          internal::LogMessage::~LogMessage(&local_c8);
          return;
        }
        *__dest = cVar4;
        __dest = __dest + 1;
      }
      iVar12 = iVar12 + 1;
    } while( true );
  }
  return;
}

Assistant:

void SubstituteAndAppend(
    string* output, const char* format,
    const SubstituteArg& arg0, const SubstituteArg& arg1,
    const SubstituteArg& arg2, const SubstituteArg& arg3,
    const SubstituteArg& arg4, const SubstituteArg& arg5,
    const SubstituteArg& arg6, const SubstituteArg& arg7,
    const SubstituteArg& arg8, const SubstituteArg& arg9) {
  const SubstituteArg* const args_array[] = {
    &arg0, &arg1, &arg2, &arg3, &arg4, &arg5, &arg6, &arg7, &arg8, &arg9, nullptr
  };

  // Determine total size needed.
  int size = 0;
  for (int i = 0; format[i] != '\0'; i++) {
    if (format[i] == '$') {
      if (ascii_isdigit(format[i+1])) {
        int index = format[i+1] - '0';
        if (args_array[index]->size() == -1) {
          GOOGLE_LOG(DFATAL)
            << "strings::Substitute format string invalid: asked for \"$"
            << index << "\", but only " << CountSubstituteArgs(args_array)
            << " args were given.  Full format string was: \""
            << CEscape(format) << "\".";
          return;
        }
        size += args_array[index]->size();
        ++i;  // Skip next char.
      } else if (format[i+1] == '$') {
        ++size;
        ++i;  // Skip next char.
      } else {
        GOOGLE_LOG(DFATAL)
          << "Invalid strings::Substitute() format string: \""
          << CEscape(format) << "\".";
        return;
      }
    } else {
      ++size;
    }
  }

  if (size == 0) return;

  // Build the string.
  int original_size = output->size();
  STLStringResizeUninitialized(output, original_size + size);
  char* target = string_as_array(output) + original_size;
  for (int i = 0; format[i] != '\0'; i++) {
    if (format[i] == '$') {
      if (ascii_isdigit(format[i+1])) {
        unsigned int index = format[i+1] - '0';
        assert(index < 10);
        const SubstituteArg* src = args_array[index];
        memcpy(target, src->data(), src->size());
        target += src->size();
        ++i;  // Skip next char.
      } else if (format[i+1] == '$') {
        *target++ = '$';
        ++i;  // Skip next char.
      }
    } else {
      *target++ = format[i];
    }
  }

  GOOGLE_DCHECK_EQ(target - output->data(), output->size());
}